

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ict.cpp
# Opt level: O2

void __thiscall PrintICT::visit(PrintICT *this,CJUMP *node)

{
  ExprNode *pEVar1;
  char *aux;
  
  aux = token_id_to_name(*(int *)&(node->super_StmNode).field_0xc);
  printLexemeIR(this,"CJUMP",aux);
  this->level = this->level + 1;
  pEVar1 = node->left;
  if (pEVar1 != (ExprNode *)0x0) {
    (*(pEVar1->super_StmNode).super_ICTNode._vptr_ICTNode[2])(pEVar1,this);
  }
  pEVar1 = node->right;
  if (pEVar1 != (ExprNode *)0x0) {
    (*(pEVar1->super_StmNode).super_ICTNode._vptr_ICTNode[2])(pEVar1,this);
  }
  if (node->ifTrue != (Label *)0x0) {
    printLexemeIR(this,"LABEL_TRUE",node->ifTrue->name);
  }
  if (node->ifFalse != (Label *)0x0) {
    printLexemeIR(this,"LABEL_FALSE",node->ifFalse->name);
  }
  this->level = this->level - 1;
  return;
}

Assistant:

void PrintICT::visit(CJUMP *node) {
    printLexemeIR("CJUMP", token_id_to_name(node->getRelop()));
    up_level();
    if (node->getLeft() != NULL) node->getLeft()->accept(this);
    if (node->getRight() != NULL) node->getRight()->accept(this);
    // TODO class Label’ has no member named ‘accept’, entao fiz o que ta ai
    if (node->getIfTrue() != NULL) printLexemeIR("LABEL_TRUE", node->getIfTrue()->getName());//->accept(this);
    if (node->getIfFalse() != NULL) printLexemeIR("LABEL_FALSE", node->getIfFalse()->getName());
    down_level();
}